

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagegenerator.cpp
# Opt level: O0

void __thiscall
stackjit::AssemblyImageGenerator::generateImage
          (AssemblyImageGenerator *this,
          vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>
          *assemblies,ostream *stream)

{
  size_t sVar1;
  undefined8 uVar2;
  bool bVar3;
  vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_> *pvVar4;
  reference pAVar5;
  vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> *pvVar6;
  reference this_00;
  string *psVar7;
  mapped_type *pmVar8;
  size_type sVar9;
  char *pcVar10;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar11;
  Class *classDef_1;
  iterator __end2_3;
  iterator __begin2_3;
  vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> *__range2_3;
  Assembly *assembly_4;
  iterator __end1_4;
  iterator __begin1_4;
  vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_> *__range1_4;
  reference local_248;
  Function *func_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_> *__range2_2;
  Assembly *assembly_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_> *__range1_3;
  size_type local_1f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_1f0;
  Class *local_1c8;
  Class *classDef;
  iterator __end2_1;
  iterator __begin2_1;
  vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> *__range2_1;
  Assembly *assembly_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_> *__range1_2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  classBodyOffsets;
  size_type local_140;
  Loader local_138 [32];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_118;
  Function *local_f0;
  Function *func;
  iterator __end2;
  iterator __begin2;
  vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_> *__range2;
  Assembly *assembly_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_> *__range1_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  funcBodyOffsets;
  Assembly *assembly;
  iterator __end1;
  iterator __begin1;
  vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_> *__range1;
  size_t numClasses;
  size_t numFuncs;
  BinaryData data;
  ostream *stream_local;
  vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_> *assemblies_local;
  AssemblyImageGenerator *this_local;
  
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = stream;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&numFuncs)
  ;
  numClasses = 0;
  __range1 = (vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_> *)0x0;
  __end1 = std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>::
           begin(assemblies);
  assembly = (Assembly *)
             std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>::
             end(assemblies);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<stackjit::Loader::Assembly_*,_std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>_>
                                *)&assembly);
    if (!bVar3) break;
    pAVar5 = __gnu_cxx::
             __normal_iterator<stackjit::Loader::Assembly_*,_std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>_>
             ::operator*(&__end1);
    pvVar4 = Loader::Assembly::functions(pAVar5);
    sVar9 = std::vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>::
            size(pvVar4);
    numClasses = numClasses + sVar9;
    pvVar6 = Loader::Assembly::classes(pAVar5);
    sVar9 = std::vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>::size
                      (pvVar6);
    __range1 = (vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_> *)
               ((long)&(__range1->
                       super__Vector_base<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>
                       )._M_impl.super__Vector_impl_data._M_start + sVar9);
    __gnu_cxx::
    __normal_iterator<stackjit::Loader::Assembly_*,_std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>_>
    ::operator++(&__end1);
  }
  anon_unknown_3::addData<unsigned_long>((BinaryData *)&numFuncs,numClasses);
  anon_unknown_3::addData<unsigned_long>((BinaryData *)&numFuncs,(unsigned_long)__range1);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)&__range1_1);
  __end1_1 = std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>::
             begin(assemblies);
  assembly_1 = (Assembly *)
               std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>
               ::end(assemblies);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<stackjit::Loader::Assembly_*,_std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>_>
                        *)&assembly_1);
    if (!bVar3) break;
    pAVar5 = __gnu_cxx::
             __normal_iterator<stackjit::Loader::Assembly_*,_std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>_>
             ::operator*(&__end1_1);
    pvVar4 = Loader::Assembly::functions(pAVar5);
    __end2 = std::vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>::
             begin(pvVar4);
    func = (Function *)
           std::vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>::end
                     (pvVar4);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<stackjit::Loader::Function_*,_std::vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>_>
                                  *)&func);
      if (!bVar3) break;
      local_f0 = __gnu_cxx::
                 __normal_iterator<stackjit::Loader::Function_*,_std::vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>_>
                 ::operator*(&__end2);
      generateFunctionDefinition(this,(BinaryData *)&numFuncs,local_f0);
      Loader::getSignature_abi_cxx11_(local_138,local_f0);
      local_140 = std::vector<char,_std::allocator<char>_>::size
                            ((vector<char,_std::allocator<char>_> *)&numFuncs);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_true>
                (&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                 &local_140);
      pVar11 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)&__range1_1,&local_118);
      classBodyOffsets._M_h._M_single_bucket =
           (__node_base_ptr)
           pVar11.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
           ._M_cur;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::~pair(&local_118);
      std::__cxx11::string::~string((string *)local_138);
      anon_unknown_3::addData<unsigned_long>((BinaryData *)&numFuncs,0);
      __gnu_cxx::
      __normal_iterator<stackjit::Loader::Function_*,_std::vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<stackjit::Loader::Assembly_*,_std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>_>
    ::operator++(&__end1_1);
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)&__range1_2);
  __end1_2 = std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>::
             begin(assemblies);
  assembly_2 = (Assembly *)
               std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>
               ::end(assemblies);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<stackjit::Loader::Assembly_*,_std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>_>
                        *)&assembly_2);
    if (!bVar3) break;
    pAVar5 = __gnu_cxx::
             __normal_iterator<stackjit::Loader::Assembly_*,_std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>_>
             ::operator*(&__end1_2);
    pvVar6 = Loader::Assembly::classes(pAVar5);
    __end2_1 = std::vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>::begin
                         (pvVar6);
    classDef = (Class *)std::
                        vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>::
                        end(pvVar6);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<stackjit::Loader::Class_*,_std::vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>_>
                          *)&classDef);
      if (!bVar3) break;
      local_1c8 = __gnu_cxx::
                  __normal_iterator<stackjit::Loader::Class_*,_std::vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>_>
                  ::operator*(&__end2_1);
      generateClassDefinition(this,(BinaryData *)&numFuncs,local_1c8);
      psVar7 = Loader::Class::name_abi_cxx11_(local_1c8);
      local_1f8 = std::vector<char,_std::allocator<char>_>::size
                            ((vector<char,_std::allocator<char>_> *)&numFuncs);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::pair<unsigned_long,_true>(&local_1f0,psVar7,&local_1f8);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *)&__range1_2,&local_1f0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::~pair(&local_1f0);
      anon_unknown_3::addData<unsigned_long>((BinaryData *)&numFuncs,0);
      __gnu_cxx::
      __normal_iterator<stackjit::Loader::Class_*,_std::vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>_>
      ::operator++(&__end2_1);
    }
    __gnu_cxx::
    __normal_iterator<stackjit::Loader::Assembly_*,_std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>_>
    ::operator++(&__end1_2);
  }
  __end1_3 = std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>::
             begin(assemblies);
  assembly_3 = (Assembly *)
               std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>
               ::end(assemblies);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_3,
                       (__normal_iterator<stackjit::Loader::Assembly_*,_std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>_>
                        *)&assembly_3);
    if (!bVar3) break;
    pAVar5 = __gnu_cxx::
             __normal_iterator<stackjit::Loader::Assembly_*,_std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>_>
             ::operator*(&__end1_3);
    pvVar4 = Loader::Assembly::functions(pAVar5);
    __end2_2 = std::vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
               ::begin(pvVar4);
    func_1 = (Function *)
             std::vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>::
             end(pvVar4);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2_2,
                         (__normal_iterator<stackjit::Loader::Function_*,_std::vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>_>
                          *)&func_1);
      if (!bVar3) break;
      local_248 = __gnu_cxx::
                  __normal_iterator<stackjit::Loader::Function_*,_std::vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>_>
                  ::operator*(&__end2_2);
      Loader::getSignature_abi_cxx11_((Loader *)&__range1_4,local_248);
      pmVar8 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     *)&__range1_1,(key_type *)&__range1_4);
      sVar1 = *pmVar8;
      sVar9 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)&numFuncs);
      anon_unknown_3::setData<unsigned_long>
                ((vector<char,_std::allocator<char>_> *)&numFuncs,sVar1,sVar9);
      std::__cxx11::string::~string((string *)&__range1_4);
      generateFunctionBody(this,(BinaryData *)&numFuncs,local_248);
      __gnu_cxx::
      __normal_iterator<stackjit::Loader::Function_*,_std::vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>_>
      ::operator++(&__end2_2);
    }
    __gnu_cxx::
    __normal_iterator<stackjit::Loader::Assembly_*,_std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>_>
    ::operator++(&__end1_3);
  }
  __end1_4 = std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>::
             begin(assemblies);
  assembly_4 = (Assembly *)
               std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>
               ::end(assemblies);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_4,
                       (__normal_iterator<stackjit::Loader::Assembly_*,_std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>_>
                        *)&assembly_4);
    uVar2 = data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
    if (!bVar3) break;
    pAVar5 = __gnu_cxx::
             __normal_iterator<stackjit::Loader::Assembly_*,_std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>_>
             ::operator*(&__end1_4);
    pvVar6 = Loader::Assembly::classes(pAVar5);
    __end2_3 = std::vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>::begin
                         (pvVar6);
    classDef_1 = (Class *)std::
                          vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
                          ::end(pvVar6);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2_3,
                         (__normal_iterator<stackjit::Loader::Class_*,_std::vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>_>
                          *)&classDef_1);
      if (!bVar3) break;
      this_00 = __gnu_cxx::
                __normal_iterator<stackjit::Loader::Class_*,_std::vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>_>
                ::operator*(&__end2_3);
      psVar7 = Loader::Class::name_abi_cxx11_(this_00);
      pmVar8 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     *)&__range1_2,psVar7);
      sVar1 = *pmVar8;
      sVar9 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)&numFuncs);
      anon_unknown_3::setData<unsigned_long>
                ((vector<char,_std::allocator<char>_> *)&numFuncs,sVar1,sVar9);
      generateClassBody(this,(BinaryData *)&numFuncs,this_00);
      __gnu_cxx::
      __normal_iterator<stackjit::Loader::Class_*,_std::vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>_>
      ::operator++(&__end2_3);
    }
    __gnu_cxx::
    __normal_iterator<stackjit::Loader::Assembly_*,_std::vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>_>
    ::operator++(&__end1_4);
  }
  pcVar10 = std::vector<char,_std::allocator<char>_>::data
                      ((vector<char,_std::allocator<char>_> *)&numFuncs);
  std::vector<char,_std::allocator<char>_>::size((vector<char,_std::allocator<char>_> *)&numFuncs);
  std::ostream::write((char *)uVar2,(long)pcVar10);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)&__range1_2);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)&__range1_1);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)&numFuncs);
  return;
}

Assistant:

void AssemblyImageGenerator::generateImage(std::vector<Loader::Assembly>& assemblies, std::ostream& stream) {
		BinaryData data;

		//Compute the number of functions & classes
		std::size_t numFuncs = 0;
		std::size_t numClasses = 0;
		for (auto& assembly : assemblies) {
			numFuncs += assembly.functions().size();
			numClasses += assembly.classes().size();
		}

		//Header
		addData(data, numFuncs);
		addData(data, numClasses);

		//Functions definitions
		std::unordered_map<std::string, std::size_t> funcBodyOffsets;

		for (auto& assembly : assemblies) {
			for (auto& func : assembly.functions()) {
				generateFunctionDefinition(data, func);
				funcBodyOffsets.insert({ Loader::getSignature(func), data.size() });
				addData<std::size_t>(data, 0);
			}
		}

		//Class definitions
		std::unordered_map<std::string, std::size_t> classBodyOffsets;

		for (auto& assembly : assemblies) {
			for (auto& classDef : assembly.classes()) {
				generateClassDefinition(data, classDef);
				classBodyOffsets.insert({ classDef.name(), data.size() });
				addData<std::size_t>(data, 0);
			}
		}

		//Functions bodies
		for (auto& assembly : assemblies) {
			for (auto& func : assembly.functions()) {
				//Patch the offset
				setData<std::size_t>(data, funcBodyOffsets.at(Loader::getSignature(func)), data.size());
				generateFunctionBody(data, func);
			}
		}

		//Class bodies
		for (auto& assembly : assemblies) {
			for (auto& classDef : assembly.classes()) {
				//Patch the offset
				setData<std::size_t>(data, classBodyOffsets.at(classDef.name()), data.size());
				generateClassBody(data, classDef);
			}
		}

		//Write to the stream
		stream.write(data.data(), data.size());
	}